

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

bool __thiscall Amiga::Chipset::DiskDMA::advance_dma(DiskDMA *this)

{
  value_type_conflict4 vVar1;
  uint16_t *puVar2;
  reference pvVar3;
  reference pvVar4;
  DiskDMA *this_local;
  
  if ((this->dma_enable_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if ((((this->write_ & 1U) == 0) && (this->length_ != 0)) &&
          (this->buffer_read_ != this->buffer_write_)) {
    pvVar3 = std::array<unsigned_short,_4UL>::operator[](&this->buffer_,this->buffer_read_ & 3);
    vVar1 = *pvVar3;
    puVar2 = (this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_;
    pvVar4 = std::array<unsigned_int,_1UL>::operator[]
                       ((array<unsigned_int,_1UL> *)
                        &(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14,0);
    puVar2[*pvVar4 & (this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_mask_] = vVar1;
    pvVar4 = std::array<unsigned_int,_1UL>::operator[]
                       ((array<unsigned_int,_1UL> *)
                        &(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14,0);
    *pvVar4 = *pvVar4 + 1;
    this->buffer_read_ = this->buffer_read_ + 1;
    this->length_ = this->length_ - 1;
    if (this->length_ == 0) {
      posit_interrupt((this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.chipset_,2);
      this->state_ = Inactive;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Chipset::DiskDMA::advance_dma() {
	if(!dma_enable_) return false;

	if(!write_) {
		if(length_ && buffer_read_ != buffer_write_) {
			ram_[pointer_[0] & ram_mask_] = buffer_[buffer_read_ & 3];
			++pointer_[0];
			++buffer_read_;
			--length_;

			if(!length_) {
				chipset_.posit_interrupt(InterruptFlag::DiskBlock);
				state_ = State::Inactive;
			}

			return true;
		}
	}

	return false;
}